

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grain_table.c
# Opt level: O0

void grain_table_entry_write(FILE *file,aom_film_grain_table_entry_t *entry)

{
  int iVar1;
  uint *in_RSI;
  FILE *in_RDI;
  int i_5;
  int i_4;
  int i_3;
  int n;
  int i_2;
  int i_1;
  int i;
  aom_film_grain_t *pars;
  int local_5c;
  int local_58;
  int local_54;
  int local_4c;
  int local_48;
  int local_44;
  
  fprintf(in_RDI,"E %ld %ld %d %d %d\n",*(undefined8 *)(in_RSI + 0xa2),
          *(undefined8 *)(in_RSI + 0xa4),(ulong)*in_RSI,(ulong)(ushort)in_RSI[0xa1],in_RSI[1]);
  if (in_RSI[1] != 0) {
    fprintf(in_RDI,"\tp %d %d %d %d %d %d %d %d %d %d %d %d\n",(ulong)in_RSI[0x4a],
            (ulong)in_RSI[0x95],(ulong)in_RSI[0xa0],(ulong)in_RSI[0x49],in_RSI[0x9f],in_RSI[0x9c],
            in_RSI[0x96],in_RSI[0x97],in_RSI[0x98],in_RSI[0x99],in_RSI[0x9a],in_RSI[0x9b]);
    fprintf(in_RDI,"\tsY %d ",(ulong)in_RSI[0x1e]);
    for (local_44 = 0; local_44 < (int)in_RSI[0x1e]; local_44 = local_44 + 1) {
      fprintf(in_RDI," %d %d",(ulong)in_RSI[(long)local_44 * 2 + 2],
              (ulong)in_RSI[(long)local_44 * 2 + 3]);
    }
    fprintf(in_RDI,"\n\tsCb %d",(ulong)in_RSI[0x33]);
    for (local_48 = 0; local_48 < (int)in_RSI[0x33]; local_48 = local_48 + 1) {
      fprintf(in_RDI," %d %d",(ulong)in_RSI[(long)local_48 * 2 + 0x1f],
              (ulong)in_RSI[(long)local_48 * 2 + 0x20]);
    }
    fprintf(in_RDI,"\n\tsCr %d",(ulong)in_RSI[0x48]);
    for (local_4c = 0; local_4c < (int)in_RSI[0x48]; local_4c = local_4c + 1) {
      fprintf(in_RDI," %d %d",(ulong)in_RSI[(long)local_4c * 2 + 0x34],
              (ulong)in_RSI[(long)local_4c * 2 + 0x35]);
    }
    fprintf(in_RDI,"\n\tcY");
    iVar1 = in_RSI[0x4a] * 2 * (in_RSI[0x4a] + 1);
    for (local_54 = 0; local_54 < iVar1; local_54 = local_54 + 1) {
      fprintf(in_RDI," %d",(ulong)in_RSI[(long)local_54 + 0x4b]);
    }
    fprintf(in_RDI,"\n\tcCb");
    for (local_58 = 0; local_58 <= iVar1; local_58 = local_58 + 1) {
      fprintf(in_RDI," %d",(ulong)in_RSI[(long)local_58 + 99]);
    }
    fprintf(in_RDI,"\n\tcCr");
    for (local_5c = 0; local_5c <= iVar1; local_5c = local_5c + 1) {
      fprintf(in_RDI," %d",(ulong)in_RSI[(long)local_5c + 0x7c]);
    }
    fprintf(in_RDI,"\n");
  }
  return;
}

Assistant:

static void grain_table_entry_write(FILE *file,
                                    aom_film_grain_table_entry_t *entry) {
  const aom_film_grain_t *pars = &entry->params;
  fprintf(file, "E %" PRId64 " %" PRId64 " %d %d %d\n", entry->start_time,
          entry->end_time, pars->apply_grain, pars->random_seed,
          pars->update_parameters);
  if (pars->update_parameters) {
    fprintf(file, "\tp %d %d %d %d %d %d %d %d %d %d %d %d\n",
            pars->ar_coeff_lag, pars->ar_coeff_shift, pars->grain_scale_shift,
            pars->scaling_shift, pars->chroma_scaling_from_luma,
            pars->overlap_flag, pars->cb_mult, pars->cb_luma_mult,
            pars->cb_offset, pars->cr_mult, pars->cr_luma_mult,
            pars->cr_offset);
    fprintf(file, "\tsY %d ", pars->num_y_points);
    for (int i = 0; i < pars->num_y_points; ++i) {
      fprintf(file, " %d %d", pars->scaling_points_y[i][0],
              pars->scaling_points_y[i][1]);
    }
    fprintf(file, "\n\tsCb %d", pars->num_cb_points);
    for (int i = 0; i < pars->num_cb_points; ++i) {
      fprintf(file, " %d %d", pars->scaling_points_cb[i][0],
              pars->scaling_points_cb[i][1]);
    }
    fprintf(file, "\n\tsCr %d", pars->num_cr_points);
    for (int i = 0; i < pars->num_cr_points; ++i) {
      fprintf(file, " %d %d", pars->scaling_points_cr[i][0],
              pars->scaling_points_cr[i][1]);
    }
    fprintf(file, "\n\tcY");
    const int n = 2 * pars->ar_coeff_lag * (pars->ar_coeff_lag + 1);
    for (int i = 0; i < n; ++i) {
      fprintf(file, " %d", pars->ar_coeffs_y[i]);
    }
    fprintf(file, "\n\tcCb");
    for (int i = 0; i <= n; ++i) {
      fprintf(file, " %d", pars->ar_coeffs_cb[i]);
    }
    fprintf(file, "\n\tcCr");
    for (int i = 0; i <= n; ++i) {
      fprintf(file, " %d", pars->ar_coeffs_cr[i]);
    }
    fprintf(file, "\n");
  }
}